

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_fold.hpp
# Opt level: O0

uint32_t ans_fold_mapping_and_exceptions<1u>(uint32_t x,uint8_t **except_out)

{
  uint8_t *puVar1;
  size_t thres;
  size_t offset;
  uint32_t radix_mask;
  uint32_t radix;
  uint8_t **except_out_local;
  uint32_t x_local;
  
  offset = 0;
  for (x_local = x; 0xff < x_local; x_local = x_local >> 8) {
    puVar1 = *except_out;
    *except_out = puVar1 + 1;
    *puVar1 = (uint8_t)x_local;
    offset = offset + 0xff;
  }
  return x_local + (int)offset;
}

Assistant:

uint32_t ans_fold_mapping_and_exceptions(uint32_t x, uint8_t*& except_out)
{
    const uint32_t radix = 8;
    uint32_t radix_mask = ((1 << radix) - 1);
    size_t offset = 0;
    size_t thres = 1 << (fidelity + radix - 1);
    while (x >= thres) {
        *except_out++ = x & radix_mask;
        x = x >> radix;
        offset = offset + (1 << (fidelity - 1)) * radix_mask;
    }
    return x + offset;
}